

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::OpenGLRenderer(OpenGLRenderer *this)

{
  OpenGLRenderer *this_local;
  
  Renderer::Renderer(&this->super_Renderer);
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__OpenGLRenderer_0014d730;
  Program::Program(&this->prog_texture);
  Program::Program(&this->prog_texture_bgr);
  {unnamed_type#1}::OpenGLRenderer((_unnamed_type_1_ *)&this->prog_alphaTexture);
  {unnamed_type#2}::OpenGLRenderer((_unnamed_type_2_ *)&this->prog_solid);
  {unnamed_type#3}::OpenGLRenderer((_unnamed_type_3_ *)&this->prog_colorFilter);
  BlurProgram::BlurProgram(&this->prog_blur);
  {unnamed_type#4}::OpenGLRenderer((_unnamed_type_4_ *)&this->prog_shadow);
  this->m_numLayeredNodes = 0;
  this->m_numTextureNodes = 0;
  this->m_numRectangleNodes = 0;
  this->m_numTransformNodes = 0;
  this->m_numTransformNodesWith3d = 0;
  this->m_additionalQuads = 0;
  this->m_vertexIndex = 0;
  this->m_elementIndex = 0;
  this->m_vertices = (vec2 *)0x0;
  this->m_elements = (Element *)0x0;
  mat4::mat4(&this->m_proj);
  mat4::mat4(&this->m_m2d);
  mat4::mat4(&this->m_m3d);
  this->m_farPlane = 0.0;
  rect2d::rect2d(&this->m_layerBoundingBox);
  vec2::vec2(&this->m_surfaceSize,0.0);
  TexturePool::TexturePool(&this->m_texturePool);
  this->m_activeShader = (Program *)0x0;
  this->m_texCoordBuffer = 0;
  this->m_vertexBuffer = 0;
  this->m_fbo = 0;
  this->m_matrixState = 0xffffffff;
  this->field_0x1f8 = this->field_0x1f8 & 0xfe;
  this->field_0x1f8 = this->field_0x1f8 & 0xfd;
  this->field_0x1f8 = this->field_0x1f8 & 0xfb;
  (*(this->super_Renderer)._vptr_Renderer[3])();
  return;
}

Assistant:

inline OpenGLRenderer::OpenGLRenderer()
    : m_numLayeredNodes(0)
    , m_numTextureNodes(0)
    , m_numRectangleNodes(0)
    , m_numTransformNodes(0)
    , m_numTransformNodesWith3d(0)
    , m_additionalQuads(0)
    , m_vertexIndex(0)
    , m_elementIndex(0)
    , m_vertices(0)
    , m_elements(0)
    , m_farPlane(0)
    , m_activeShader(0)
    , m_texCoordBuffer(0)
    , m_vertexBuffer(0)
    , m_fbo(0)
    , m_matrixState(UpdateAllPrograms)
    , m_render3d(false)
    , m_layered(false)
    , m_srgb(false)
{
    initialize();
}